

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codafind.c
# Opt level: O0

void print_help(void)

{
  printf("Usage:\n");
  printf("    codafind [-D definitionpath] [<options>] <files|directories>\n");
  printf("        Match a filter on a series of files and/or recursively on all contents\n");
  printf("        of directories\n");
  printf("\n");
  printf("        Options:\n");
  printf("            -d, --disable_conversions\n");
  printf("                    do not perform unit/value conversions\n");
  printf("            -f, --filter \'<filter expression>\'\n");
  printf("                    restrict the output to data that matches the filter\n");
  printf("                    if no filter is provided codafind will find all files that\n");
  printf("                    can be opened with CODA\n");
  printf("            -V, --verbose\n");
  printf("                    show the match result for each file\n");
  printf("\n");
  printf("    codafind -h, --help\n");
  printf("        Show help (this text)\n");
  printf("\n");
  printf("    codafind -v, --version\n");
  printf("        Print the version number of CODA and exit\n");
  printf("\n");
  printf("    CODA will look for .codadef files using a definition path, which is a \':\'\n");
  printf("    separated (\';\' on Windows) list of paths to .codadef files and/or to\n");
  printf("    directories containing .codadef files.\n");
  printf("    By default the definition path is set to a single directory relative to\n");
  printf("    the tool location. A different definition path can be set via the\n");
  printf("    CODA_DEFINITION environment variable or via the -D option.\n");
  printf("    (the -D option overrides the environment variable setting).\n");
  printf("\n");
  return;
}

Assistant:

static void print_help(void)
{
    printf("Usage:\n");
    printf("    codafind [-D definitionpath] [<options>] <files|directories>\n");
    printf("        Match a filter on a series of files and/or recursively on all contents\n");
    printf("        of directories\n");
    printf("\n");
    printf("        Options:\n");
    printf("            -d, --disable_conversions\n");
    printf("                    do not perform unit/value conversions\n");
    printf("            -f, --filter '<filter expression>'\n");
    printf("                    restrict the output to data that matches the filter\n");
    printf("                    if no filter is provided codafind will find all files that\n");
    printf("                    can be opened with CODA\n");
    printf("            -V, --verbose\n");
    printf("                    show the match result for each file\n");
    printf("\n");
    printf("    codafind -h, --help\n");
    printf("        Show help (this text)\n");
    printf("\n");
    printf("    codafind -v, --version\n");
    printf("        Print the version number of CODA and exit\n");
    printf("\n");
    printf("    CODA will look for .codadef files using a definition path, which is a ':'\n");
    printf("    separated (';' on Windows) list of paths to .codadef files and/or to\n");
    printf("    directories containing .codadef files.\n");
    printf("    By default the definition path is set to a single directory relative to\n");
    printf("    the tool location. A different definition path can be set via the\n");
    printf("    CODA_DEFINITION environment variable or via the -D option.\n");
    printf("    (the -D option overrides the environment variable setting).\n");
    printf("\n");
}